

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

qint64 __thiscall QRingBuffer::indexOf(QRingBuffer *this,char c,qint64 maxLength,qint64 pos)

{
  bool bVar1;
  QRingChunk *pQVar2;
  qsizetype qVar3;
  longlong *plVar4;
  void *pvVar5;
  long in_RCX;
  QRingChunk *in_RDX;
  char in_SIL;
  long in_FS_OFFSET;
  char *findPtr;
  char *ptr;
  qint64 nextBlockIndex;
  QRingChunk *chunk;
  QList<QRingChunk> *__range1;
  qint64 index;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QRingChunk> *in_stack_ffffffffffffff70;
  QRingChunk *this_00;
  char *local_78;
  QRingChunk *local_58;
  long local_38;
  long local_30;
  QRingChunk *local_28;
  const_iterator local_20;
  const_iterator local_18;
  QRingChunk *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (QRingChunk *)0x0) {
    local_38 = -1;
  }
  else {
    local_18.i = (QRingChunk *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = in_RDX;
    local_18 = QList<QRingChunk>::begin(in_stack_ffffffffffffff70);
    local_20.i = (QRingChunk *)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QList<QRingChunk>::end(in_stack_ffffffffffffff70);
    local_58 = (QRingChunk *)-in_RCX;
    while( true ) {
      local_28 = local_20.i;
      bVar1 = QList<QRingChunk>::const_iterator::operator!=(&local_18,local_20);
      if (!bVar1) break;
      pQVar2 = QList<QRingChunk>::const_iterator::operator*(&local_18);
      this_00 = local_58;
      qVar3 = QRingChunk::size(pQVar2);
      local_30 = (long)&(this_00->chunk).d.d + qVar3;
      plVar4 = qMin<long_long>(&local_30,(longlong *)&local_10);
      pQVar2 = (QRingChunk *)*plVar4;
      if (0 < (long)pQVar2) {
        local_78 = QRingChunk::data(this_00);
        if ((long)local_58 < 0) {
          local_78 = local_78 + -(long)local_58;
          local_58 = (QRingChunk *)0x0;
        }
        pvVar5 = memchr(local_78,(int)in_SIL,(long)pQVar2 - (long)local_58);
        if (pvVar5 != (void *)0x0) {
          local_38 = (long)local_58 + (long)pvVar5 + (in_RCX - (long)local_78);
          goto LAB_0020c995;
        }
        if (pQVar2 == local_10) {
          local_38 = -1;
          goto LAB_0020c995;
        }
      }
      QList<QRingChunk>::const_iterator::operator++(&local_18);
      local_58 = pQVar2;
    }
    local_38 = -1;
  }
LAB_0020c995:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

qint64 QRingBuffer::indexOf(char c, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    if (maxLength == 0)
        return -1;

    qint64 index = -pos;
    for (const QRingChunk &chunk : buffers) {
        const qint64 nextBlockIndex = qMin(index + chunk.size(), maxLength);

        if (nextBlockIndex > 0) {
            const char *ptr = chunk.data();
            if (index < 0) {
                ptr -= index;
                index = 0;
            }

            const char *findPtr = reinterpret_cast<const char *>(memchr(ptr, c,
                                                                        nextBlockIndex - index));
            if (findPtr)
                return qint64(findPtr - ptr) + index + pos;

            if (nextBlockIndex == maxLength)
                return -1;
        }
        index = nextBlockIndex;
    }
    return -1;
}